

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O2

void done_gesture_proc(Am_Object *cmd)

{
  int iVar1;
  char cVar2;
  Am_Value *pAVar3;
  Am_Wrapper *pAVar4;
  Am_Object cls;
  Am_Value_List examples;
  Am_Object example;
  Am_String class_name;
  Am_Feature_Vector feat;
  Am_Object local_70;
  Am_Feature_Vector local_68 [8];
  Am_Feature_Vector local_60 [8];
  Am_String local_58;
  Am_Object inter;
  Am_Object local_48;
  Am_Point_List pl;
  
  Am_Object::Get_Owner(&inter,(Am_Slot_Flags)cmd);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)&inter,0xb2);
  Am_Point_List::Am_Point_List(&pl,pAVar3);
  Am_Feature_Vector::Am_Feature_Vector(&feat,&pl);
  pAVar3 = (Am_Value *)Am_Object::Get(0x550,0x169);
  Am_String::Am_String((Am_String *)&examples,pAVar3);
  cVar2 = Am_String::operator==((Am_String *)&examples,&training_mode);
  Am_String::~Am_String((Am_String *)&examples);
  if (cVar2 == '\0') {
    pAVar3 = (Am_Value *)Am_Object::Get((ushort)cmd,0x169);
    Am_String::Am_String((Am_String *)&cls,pAVar3);
    cVar2 = Am_String::Valid();
    if (cVar2 == '\0') {
      Am_Object::Am_Object(&local_70,(Am_Object *)&Am_No_Object);
      Am_Beep((Am_Object_Data *)&local_70);
      Am_Object::~Am_Object(&local_70);
      Am_Object::Set(0x500,0x169,0);
    }
    else {
      pAVar3 = (Am_Value *)Am_Object::Get(0x500,0xa2);
      Am_Value_List::Am_Value_List(&examples,pAVar3);
      Am_Value_List::Start();
      while( true ) {
        cVar2 = Am_Value_List::Last();
        if (cVar2 != '\0') break;
        pAVar3 = (Am_Value *)Am_Value_List::Get();
        Am_Object::Am_Object((Am_Object *)&class_name,pAVar3);
        pAVar3 = (Am_Value *)
                 Am_Object::Get((ushort)(Am_Object *)&class_name,(ulong)(ushort)CLASS_NAME);
        Am_String::Am_String((Am_String *)&example,pAVar3);
        cVar2 = Am_String::operator==((Am_String *)&example,(Am_String *)&cls);
        Am_String::~Am_String((Am_String *)&example);
        if (cVar2 != '\0') {
          pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&class_name);
          Am_Object::Set(0x500,(Am_Wrapper *)0x169,(ulong)pAVar4);
          Am_Object::Get_Owner(&local_48,(Am_Slot_Flags)&class_name);
          scroll_into_view(&local_48);
          Am_Object::~Am_Object(&local_48);
        }
        Am_Object::~Am_Object((Am_Object *)&class_name);
        Am_Value_List::Next();
      }
      Am_Value_List::~Am_Value_List(&examples);
    }
    Am_Object::Set(0x520,0x169,0);
    Am_String::~Am_String((Am_String *)&cls);
  }
  else {
    pAVar3 = (Am_Value *)Am_Object::Get(0x500,0x169);
    Am_Object::Am_Object(&cls,pAVar3);
    cVar2 = Am_Object::Valid();
    if (cVar2 != '\0') {
      pAVar3 = (Am_Value *)Am_Object::Get((ushort)&cls,(ulong)(ushort)CLASS_NAME);
      Am_String::Am_String(&class_name,pAVar3);
      pAVar3 = (Am_Value *)Am_Object::Get((ushort)&cls,(ulong)(CLASS_EXAMPLES & 0xffff));
      Am_Value_List::Am_Value_List(&examples,pAVar3);
      cVar2 = Am_Value_List::Empty();
      Am_String::Am_String(&local_58,&class_name);
      Am_Feature_Vector::Am_Feature_Vector(local_60,&feat);
      Am_Gesture_Trainer::Add_Example(&trainer,&local_58,local_60,1);
      Am_Feature_Vector::~Am_Feature_Vector(local_60);
      Am_String::~Am_String(&local_58);
      Am_Feature_Vector::Am_Feature_Vector(local_68,&feat);
      Example_Create((Am_Feature_Vector *)&example);
      Am_Feature_Vector::~Am_Feature_Vector(local_68);
      pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&example);
      Am_Value_List::Add((Am_Wrapper *)&examples,(Am_Add_Position)pAVar4,true);
      iVar1 = CLASS_EXAMPLES;
      if (cVar2 == '\0') {
        Am_Object::Note_Changed((ushort)&cls);
      }
      else {
        pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(&examples);
        Am_Object::Set((ushort)&cls,(Am_Wrapper *)(ulong)(iVar1 & 0xffff),(ulong)pAVar4);
      }
      dirty = true;
      Am_Object::~Am_Object(&example);
      Am_Value_List::~Am_Value_List(&examples);
      Am_String::~Am_String(&class_name);
    }
    Am_Object::~Am_Object(&cls);
  }
  Am_Feature_Vector::~Am_Feature_Vector(&feat);
  Am_Point_List::~Am_Point_List(&pl);
  Am_Object::~Am_Object(&inter);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, done_gesture, (Am_Object cmd))
{
  Am_Object inter = cmd.Get_Owner();
  Am_Point_List pl = inter.Get(Am_POINT_LIST);
  Am_Feature_Vector feat(pl);

  if (Am_String(mode.Get(Am_VALUE)) == training_mode) {
    Am_Object cls = class_panel.Get(Am_VALUE);
    if (cls.Valid()) {
      Am_String class_name = cls.Get(CLASS_NAME);
      Am_Value_List examples = cls.Get(CLASS_EXAMPLES);
      bool new_list = examples.Empty();

      trainer.Add_Example(class_name, feat);

      Am_Object example = Example_Create(feat);
      examples.Add(example, Am_TAIL, false);
      if (new_list)
        cls.Set(CLASS_EXAMPLES, examples);
      else
        cls.Note_Changed(CLASS_EXAMPLES);

      // select it?
      // example_panel.Set (Am_VALUE, example);

      // the classifier has changed, so set dirty flag
      dirty = true;
    }
  }

  else {
    // search for recognized class and select it
    Am_String recognized = cmd.Get(Am_VALUE);

    if (!recognized.Valid()) {
      // unrecognized!
      Am_Beep();
      class_panel.Set(Am_VALUE, 0);
    } else {
      // search for recognized class name
      Am_Value_List l = class_panel.Get(Am_ITEMS);
      for (l.Start(); !l.Last(); l.Next()) {
        Am_Object cls = l.Get();
        if (Am_String(cls.Get(CLASS_NAME)) == recognized) {
          class_panel.Set(Am_VALUE, cls);
          scroll_into_view(cls.Get_Owner());
        }
      }
    }
    example_panel.Set(Am_VALUE, 0);
  }
}